

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

int ncnn::conv3x3s1_winograd23_int8_xop(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  Mat *pMVar19;
  int *piVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  Mat *pMVar27;
  ulong uVar28;
  int m_2;
  int M;
  int K;
  int iVar29;
  void *pvVar30;
  int iVar31;
  long lVar32;
  int *piVar33;
  long lVar34;
  ulong uVar35;
  int (*paiVar36) [4];
  ulong uVar37;
  int iVar38;
  uint uVar39;
  int *piVar40;
  int m_4;
  int N;
  uint uVar41;
  int m_3;
  Option *pOVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar47 [16];
  Allocator *_allocator;
  int TILE_N;
  Option *local_2b0;
  ulong local_2a8;
  Mat *local_2a0;
  ulong local_298;
  int local_290;
  int TILE_M;
  Mat *local_288;
  void *local_280;
  ulong local_278;
  ulong local_270;
  int local_268;
  int TILE_K;
  ulong local_260;
  Mat m;
  int local_208;
  int tmp [2] [4] [4];
  Mat local_138;
  Mat m_1;
  Mat local_78;
  
  auVar43 = in_ZMM1._0_16_;
  iVar9 = cpu_support_x86_avx_vnni();
  if (iVar9 != 0) {
    iVar9 = conv3x3s1_winograd23_int8_avxvnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar9;
  }
  iVar9 = cpu_support_x86_avx2();
  if (iVar9 != 0) {
    iVar9 = conv3x3s1_winograd23_int8_avx2(bottom_blob,top_blob,AT,nT,opt);
    return iVar9;
  }
  uVar1 = top_blob->w;
  uVar2 = top_blob->h;
  auVar44._4_4_ = uVar2;
  auVar44._0_4_ = uVar1;
  auVar43 = vpcmpeqd_avx(auVar43,auVar43);
  auVar44._8_8_ = 0;
  auVar43 = vpsubd_avx(auVar44,auVar43);
  auVar44 = vpsrld_avx(auVar43,0x1f);
  auVar43 = vpaddd_avx(auVar43,auVar44);
  auVar43 = vpsrad_avx(auVar43,1);
  M = top_blob->elempack * top_blob->c;
  N = auVar43._4_4_ * auVar43._0_4_;
  K = bottom_blob->elempack * bottom_blob->c;
  local_2a0 = bottom_blob;
  get_optimal_tile_mnk_int8(M,N,K,&TILE_M,&TILE_N,&TILE_K,nT);
  iVar9 = TILE_K;
  local_290 = (M + TILE_M + -1) / TILE_M;
  local_298 = (ulong)(uint)TILE_N;
  iVar38 = (TILE_N + N + -1) / TILE_N;
  iVar10 = (TILE_K + K + -1) / TILE_K;
  _allocator = opt->workspace_allocator;
  local_138.cstep = 0;
  iVar29 = TILE_K * TILE_N;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  local_2b0 = opt;
  Mat::create(&local_138,iVar29,0x10,iVar10,iVar38,2,_allocator);
  local_208 = -100;
  if ((local_138.data == (void *)0x0) || ((long)local_138.c * local_138.cstep == 0))
  goto LAB_00249080;
  uVar39 = iVar38 * iVar10;
  iVar29 = iVar29 * 0x10;
  iVar38 = -100;
  if ((nT < 2) || (nT <= (int)uVar39)) {
    tmp[1][0][0] = 0;
    tmp[1][0][1] = 0;
    tmp[0][0][0] = 0;
    tmp[0][0][1] = 0;
    tmp[0][0][2] = 0;
    tmp[0][0][3] = 0;
    tmp[0][1][0] = 0;
    tmp[0][1][1] = 0;
    tmp[0][1][2] = 0;
    tmp[0][2][0] = 0;
    tmp[0][2][1] = 0;
    tmp[0][2][2] = 0;
    tmp[0][2][3] = 0;
    tmp[0][3][0] = 0;
    tmp[0][3][1] = 0;
    tmp[0][3][2] = 0;
    Mat::create((Mat *)tmp,iVar29,1,nT,2,local_2b0->workspace_allocator);
    if ((tmp[0][0]._0_8_ != 0) && ((long)tmp[0][3][2] * tmp[1][0]._0_8_ != 0)) {
      pvVar14 = (void *)0x0;
      pvVar30 = (void *)(ulong)uVar39;
      if ((int)uVar39 < 1) {
        pvVar30 = pvVar14;
      }
      local_2a8 = CONCAT44(local_2a8._4_4_,(int)pvVar30);
      while (pOVar42 = local_2b0, iVar29 = (int)pvVar14, (int)pvVar30 != iVar29) {
        iVar23 = (int)local_298;
        iVar31 = (iVar29 / iVar10) * iVar23;
        local_270 = CONCAT44(local_270._4_4_,iVar29 % iVar10);
        iVar21 = (iVar29 % iVar10) * iVar9;
        iVar38 = N - iVar31;
        if (iVar23 < iVar38) {
          iVar38 = iVar23;
        }
        iVar23 = K - iVar21;
        if (iVar9 < iVar23) {
          iVar23 = iVar9;
        }
        local_280 = pvVar14;
        iVar11 = get_omp_thread_num();
        m.data = (void *)((long)iVar11 * tmp[1][0]._0_8_ * tmp[0][1]._0_8_ + tmp[0][0]._0_8_);
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = tmp[0][1][0];
        m.elemsize._4_4_ = tmp[0][1][1];
        m.elempack = tmp[0][1][2];
        m.allocator = (Allocator *)tmp[0][2]._0_8_;
        m.w = tmp[0][2][3];
        m.h = tmp[0][3][0];
        m.d = 1;
        m.c = tmp[0][3][1];
        m.dims = tmp[0][2][2] + -1;
        m.cstep = (tmp[0][1]._0_8_ * (long)tmp[0][3][0] * (long)tmp[0][2][3] + 0xfU &
                  0xfffffffffffffff0) / (ulong)tmp[0][1]._0_8_;
        if (tmp[0][2][2] == 4) {
          m.cstep = (long)tmp[0][3][0] * (long)tmp[0][2][3];
        }
        conv3x3s1_winograd23_transform_input_tile_int8
                  (local_2a0,&m,iVar31,iVar38,iVar21,iVar23,(int)_allocator);
        m_1.cstep = (long)local_138.h * (long)local_138.w;
        m_1.data = (void *)((long)local_138.data +
                           (local_270 & 0xffffffff) * local_138.elemsize * m_1.cstep +
                           (long)(iVar29 / iVar10) * local_138.cstep * local_138.elemsize);
        m_1.refcount = (int *)0x0;
        m_1.elemsize = local_138.elemsize;
        m_1.elempack = local_138.elempack;
        m_1.allocator = local_138.allocator;
        m_1.dims = 2;
        m_1.w = local_138.w;
        m_1.h = local_138.h;
        m_1.d = 1;
        m_1.c = 1;
        transpose_pack_B_tile_int8(&m,&m_1,0x10,iVar38,iVar23,(int)m_1.cstep);
        pvVar14 = (void *)(ulong)((int)local_280 + 1);
        pvVar30 = (void *)(local_2a8 & 0xffffffff);
      }
      piVar33 = (int *)CONCAT44(tmp[0][0][3],tmp[0][0][2]);
      if (piVar33 != (int *)0x0) {
        LOCK();
        *piVar33 = *piVar33 + -1;
        UNLOCK();
        if (*piVar33 == 0) {
          if (tmp[0][2]._0_8_ == 0) goto LAB_0024857b;
          (**(code **)(*(long *)tmp[0][2]._0_8_ + 0x18))();
        }
      }
      goto LAB_00248583;
    }
    piVar33 = (int *)CONCAT44(tmp[0][0][3],tmp[0][0][2]);
    if (piVar33 == (int *)0x0) goto LAB_00249080;
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 != 0) goto LAB_00249080;
    pvVar30 = (void *)tmp[0][0]._0_8_;
    if (tmp[0][2]._0_8_ != 0) {
      (**(code **)(*(long *)tmp[0][2]._0_8_ + 0x18))();
      goto LAB_00249080;
    }
  }
  else {
    tmp[1][0][0] = 0;
    tmp[1][0][1] = 0;
    tmp[0][0][0] = 0;
    tmp[0][0][1] = 0;
    tmp[0][0][2] = 0;
    tmp[0][0][3] = 0;
    tmp[0][1][0] = 0;
    tmp[0][1][1] = 0;
    tmp[0][1][2] = 0;
    tmp[0][2][0] = 0;
    tmp[0][2][1] = 0;
    tmp[0][2][2] = 0;
    tmp[0][2][3] = 0;
    tmp[0][3][0] = 0;
    tmp[0][3][1] = 0;
    tmp[0][3][2] = 0;
    Mat::create((Mat *)tmp,iVar29,2,local_2b0->workspace_allocator);
    if ((tmp[0][0]._0_8_ == 0) || ((long)tmp[0][3][2] * tmp[1][0]._0_8_ == 0)) {
      piVar33 = (int *)CONCAT44(tmp[0][0][3],tmp[0][0][2]);
      if (piVar33 == (int *)0x0) goto LAB_00249080;
      LOCK();
      *piVar33 = *piVar33 + -1;
      UNLOCK();
      if (*piVar33 != 0) goto LAB_00249080;
      pvVar30 = (void *)tmp[0][0]._0_8_;
      if (tmp[0][2]._0_8_ != 0) {
        (**(code **)(*(long *)tmp[0][2]._0_8_ + 0x18))();
        goto LAB_00249080;
      }
    }
    else {
      uVar41 = 0;
      if ((int)uVar39 < 1) {
        uVar39 = uVar41;
      }
      local_2a8 = CONCAT44(local_2a8._4_4_,uVar39);
      for (; pOVar42 = local_2b0, uVar39 != uVar41; uVar41 = uVar41 + 1) {
        iVar38 = (int)local_298;
        iVar23 = ((int)uVar41 / iVar10) * iVar38;
        iVar31 = (int)((long)(int)uVar41 % (long)iVar10) * iVar9;
        iVar29 = N - iVar23;
        if (iVar38 < iVar29) {
          iVar29 = iVar38;
        }
        iVar38 = K - iVar31;
        if (iVar9 < iVar38) {
          iVar38 = iVar9;
        }
        conv3x3s1_winograd23_transform_input_tile_int8
                  (local_2a0,(Mat *)tmp,iVar23,iVar29,iVar31,iVar38,(int)_allocator);
        m.cstep = (long)local_138.h * (long)local_138.w;
        m.data = (void *)((long)local_138.data +
                         ((long)(int)uVar41 % (long)iVar10 & 0xffffffffU) * local_138.elemsize *
                         m.cstep + (long)((int)uVar41 / iVar10) * local_138.cstep *
                                   local_138.elemsize);
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize = local_138.elemsize;
        m.elempack = local_138.elempack;
        m.allocator = local_138.allocator;
        m.dims = 2;
        m.w = local_138.w;
        m.h = local_138.h;
        m.d = 1;
        m.c = 1;
        uVar39 = (uint)local_2a8;
        transpose_pack_B_tile_int8((Mat *)tmp,&m,0x10,iVar29,iVar38,(int)m.cstep);
      }
      piVar33 = (int *)CONCAT44(tmp[0][0][3],tmp[0][0][2]);
      if (piVar33 != (int *)0x0) {
        LOCK();
        *piVar33 = *piVar33 + -1;
        UNLOCK();
        if (*piVar33 == 0) {
          if (tmp[0][2]._0_8_ == 0) {
LAB_0024857b:
            pOVar42 = local_2b0;
            free((void *)tmp[0][0]._0_8_);
          }
          else {
            (**(code **)(*(long *)tmp[0][2]._0_8_ + 0x18))();
          }
        }
      }
LAB_00248583:
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,TILE_N * TILE_M * 0x10,1,nT,4,pOVar42->workspace_allocator);
      local_208 = -100;
      if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
        local_208 = 0;
        if (local_290 < 1) {
          local_290 = 0;
        }
        iVar9 = 0;
        local_288 = top_blob;
        while (iVar10 = TILE_M, iVar9 != local_290) {
          local_268 = iVar9;
          iVar9 = get_omp_thread_num();
          m_1.data = (void *)((long)iVar9 * m.cstep * m.elemsize + (long)m.data);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = m.elemsize;
          m_1.elempack = m.elempack;
          m_1.allocator = m.allocator;
          m_1.w = m.w;
          m_1.h = m.h;
          m_1.c = m.d;
          m_1.d = 1;
          m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          m_1.dims = m.dims + -1;
          if (m.dims == 4) {
            m_1.cstep = (long)m.h * (long)m.w;
          }
          iVar29 = iVar10 * local_268;
          iVar9 = M - iVar29;
          if (iVar10 < M - iVar29) {
            iVar9 = iVar10;
          }
          lVar15 = (long)iVar9;
          for (iVar10 = 0; iVar23 = TILE_K, iVar38 = TILE_N, uVar39 = N - iVar10,
              uVar39 != 0 && iVar10 <= N; iVar10 = iVar10 + TILE_N) {
            if (TILE_N < (int)uVar39) {
              uVar39 = TILE_N;
            }
            local_260 = (ulong)uVar39;
            local_298 = CONCAT44(local_298._4_4_,TILE_M);
            iVar21 = 0;
            iVar31 = K;
            while (iVar11 = (int)local_260, iVar21 < K) {
              iVar12 = iVar31;
              if (iVar23 < iVar31) {
                iVar12 = iVar23;
              }
              tmp[0][2][3] = AT->w;
              tmp[0][3][0] = AT->h;
              tmp[0][1]._0_8_ = AT->elemsize;
              tmp[0][1][2] = AT->elempack;
              tmp[0][2]._0_8_ = AT->allocator;
              tmp[1][0]._0_8_ = (long)tmp[0][3][0] * (long)tmp[0][2][3];
              tmp[0][0]._0_8_ =
                   (long)AT->data +
                   tmp[0][1]._0_8_ * tmp[1][0]._0_8_ * (long)(iVar21 / iVar23) +
                   (long)(iVar29 / (int)local_298) * AT->cstep * tmp[0][1]._0_8_;
              tmp[0][0][2] = 0;
              tmp[0][0][3] = 0;
              tmp[0][2][2] = 2;
              tmp[0][3][1] = 1;
              tmp[0][3][2] = 1;
              local_78.cstep = (long)local_138.h * (long)local_138.w;
              local_78.data =
                   (void *)((long)local_138.data +
                           local_78.cstep * local_138.elemsize * (long)(iVar21 / iVar23) +
                           (long)(iVar10 / iVar38) * local_138.cstep * local_138.elemsize);
              local_78.refcount = (int *)0x0;
              local_78.elemsize = local_138.elemsize;
              local_78.elempack = local_138.elempack;
              local_78.allocator = local_138.allocator;
              local_78.w = local_138.w;
              iVar31 = -(iVar23 - iVar31);
              local_78.h = local_138.h;
              local_78.d = 1;
              local_78.c = 1;
              local_78.dims = tmp[0][2][2];
              gemm_transB_packed_tile_int8
                        ((Mat *)tmp,&local_78,&m_1,0x10,iVar9,iVar11,iVar21,iVar12,
                         K <= iVar21 + iVar23);
              iVar21 = iVar21 + iVar23;
            }
            iVar38 = local_288->w;
            iVar23 = local_288->elempack;
            iVar31 = local_288->h;
            iVar21 = (int)local_288->cstep * iVar23;
            iVar12 = (iVar38 + 1) / 2;
            local_2b0 = (Option *)CONCAT44(local_2b0._4_4_,iVar12);
            lVar32 = (long)(iVar11 * 4);
            lVar22 = (long)iVar21;
            local_2a8 = (ulong)(iVar21 * 2);
            local_280 = (void *)(long)(iVar21 * 3);
            local_2a0 = (Mat *)(long)(iVar23 * iVar38);
            iVar21 = 0;
            local_270 = 0;
            if (0 < iVar11) {
              local_270 = local_260 & 0xffffffff;
            }
            lVar34 = (long)(iVar11 * 8) * 4;
            local_298 = lVar32 * 4;
            uVar35 = 0;
            while (uVar28 = uVar35, (long)(uVar28 | 3) < lVar15) {
              lVar16 = (long)iVar21;
              lVar26 = 0;
              for (uVar35 = 0; uVar35 != local_270; uVar35 = uVar35 + 1) {
                lVar17 = (long)m_1.data + lVar26;
                for (lVar25 = -0x40; lVar25 != 0; lVar25 = lVar25 + 0x10) {
                  auVar43 = *(undefined1 (*) [16])(lVar17 + local_298 + lVar16 * 4);
                  auVar44 = *(undefined1 (*) [16])(lVar17 + lVar34 + lVar16 * 4);
                  auVar45 = vpaddd_avx(auVar43,*(undefined1 (*) [16])(lVar17 + lVar16 * 4));
                  auVar45 = vpaddd_avx(auVar45,auVar44);
                  auVar43 = vpsubd_avx(auVar43,auVar44);
                  auVar43 = vpaddd_avx(auVar43,*(undefined1 (*) [16])
                                                (lVar17 + (long)(iVar11 * 0xc) * 4 + lVar16 * 4));
                  *(undefined1 (*) [16])((long)tmp[1][0] + lVar25) = auVar45;
                  *(undefined1 (*) [16])((long)&local_138.data + lVar25) = auVar43;
                  lVar17 = lVar17 + (long)(iVar11 * 0x10) * 4;
                }
                iVar13 = iVar10 + (int)uVar35;
                iVar24 = iVar13 % iVar12;
                uVar39 = (iVar13 / iVar12) * 2;
                pauVar18 = (undefined1 (*) [16])
                           ((long)local_288->data +
                           (long)(iVar24 * 2 * iVar23) * 4 +
                           (long)local_288->w * local_288->elemsize * (long)(int)uVar39 +
                           (long)((iVar29 + (int)uVar28) / iVar23) * local_288->cstep *
                           local_288->elemsize);
                iVar24 = iVar24 * 2 + 1;
                paiVar36 = tmp[0] + 3;
                for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                  if ((int)(uVar39 | (uint)lVar25) < iVar31) {
                    auVar43 = vpaddd_avx((undefined1  [16])paiVar36[-2],
                                         (undefined1  [16])(*(int (*) [4] [4])(paiVar36 + -3))[0]);
                    auVar44 = vpsubd_avx((undefined1  [16])paiVar36[-2],
                                         (undefined1  [16])paiVar36[-1]);
                    auVar44 = vpaddd_avx(auVar44,(undefined1  [16])*paiVar36);
                    auVar43 = vpaddd_avx(auVar43,(undefined1  [16])paiVar36[-1]);
                    auVar45 = vpsrad_avx(auVar43,2);
                    auVar43 = vpsrad_avx(auVar44,2);
                    if (iVar23 == 1) {
                      *(int *)*pauVar18 = auVar45._0_4_;
                      *(int *)(*pauVar18 + lVar22 * 4) = auVar45._4_4_;
                      *(int *)(*pauVar18 + local_2a8 * 4) = auVar45._8_4_;
                      *(int *)(*pauVar18 + (long)local_280 * 4) = auVar45._12_4_;
                      if (iVar24 < iVar38) {
                        *(int *)(*pauVar18 + 4) = auVar43._0_4_;
                        *(int *)(*pauVar18 + lVar22 * 4 + 4) = auVar43._4_4_;
                        *(int *)(*pauVar18 + local_2a8 * 4 + 4) = auVar43._8_4_;
                        *(int *)(*pauVar18 + (long)local_280 * 4 + 4) = auVar43._12_4_;
                      }
                    }
                    else if ((iVar23 == 4) && (*pauVar18 = auVar45, iVar24 < iVar38)) {
                      pauVar18[1] = auVar43;
                    }
                    pauVar18 = (undefined1 (*) [16])(*pauVar18 + (long)local_2a0 * 4);
                  }
                  paiVar36 = paiVar36 + 4;
                }
                lVar26 = lVar26 + 0x10;
              }
              iVar21 = iVar21 + iVar11 * 0x40;
              local_278 = uVar28;
              uVar35 = uVar28 + 4;
            }
            while (uVar35 = uVar28, (long)(uVar35 | 1) < lVar15) {
              sVar8 = local_288->elemsize;
              local_280 = (void *)(((long)iVar29 + uVar35) * local_288->cstep * sVar8 +
                                  (long)local_288->data);
              pMVar19 = (Mat *)((long)iVar21 * 4 + (long)m_1.data);
              uVar28 = 0;
              while (uVar37 = uVar28, pMVar27 = pMVar19, uVar37 != local_270) {
                pMVar19 = pMVar27;
                for (lVar16 = -4; lVar16 != 0; lVar16 = lVar16 + 1) {
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = pMVar19->data;
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = *(ulong *)((long)&pMVar19->data + (long)(iVar11 * 2) * 4);
                  auVar43 = vpaddd_avx(auVar45,auVar43);
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = *(ulong *)((long)&pMVar19->data + lVar32 * 4);
                  auVar43 = vpaddd_avx(auVar43,auVar47);
                  *(long *)(tmp[0][2] + lVar16 * 2) = auVar43._0_8_;
                  auVar43 = vpsubd_avx(auVar45,auVar47);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = *(ulong *)((long)&pMVar19->data + (long)(iVar11 * 6) * 4);
                  auVar43 = vpaddd_avx(auVar43,auVar46);
                  *(long *)(tmp[1][0] + lVar16 * 2) = auVar43._0_8_;
                  pMVar19 = (Mat *)((long)&pMVar19->data + lVar34);
                }
                iVar24 = iVar10 + (int)uVar37;
                iVar23 = iVar24 % iVar12;
                uVar39 = (iVar24 / iVar12) * 2;
                piVar33 = (int *)((long)local_280 +
                                 (long)(iVar23 * 2) * 4 +
                                 (long)local_288->w * sVar8 * (long)(int)uVar39);
                piVar20 = tmp[0][1] + 3;
                for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
                  if ((int)(uVar39 | (uint)lVar16) < iVar31) {
                    iVar24 = piVar20[-5];
                    iVar13 = piVar20[-4];
                    iVar3 = (*(int (*) [4])(piVar20 + -3))[0];
                    iVar4 = piVar20[-6];
                    iVar5 = piVar20[-2];
                    iVar6 = piVar20[-1];
                    iVar7 = *piVar20;
                    *piVar33 = piVar20[-7] + iVar24 + iVar3 >> 2;
                    piVar33[lVar22] = iVar4 + iVar13 + iVar5 >> 2;
                    if (iVar23 * 2 + 1 < iVar38) {
                      piVar33[1] = (iVar24 - iVar3) + iVar6 >> 2;
                      piVar33[lVar22 + 1] = (iVar13 - iVar5) + iVar7 >> 2;
                    }
                    piVar33 = piVar33 + iVar38;
                  }
                  piVar20 = piVar20 + 8;
                }
                pMVar19 = (Mat *)&pMVar27->refcount;
                local_2a8 = uVar37;
                local_2a0 = pMVar27;
                uVar28 = uVar37 + 1;
              }
              iVar21 = iVar21 + iVar11 * 0x20;
              local_278 = uVar35;
              uVar28 = uVar35 + 2;
            }
            while (uVar28 = uVar35, (long)uVar28 < lVar15) {
              sVar8 = local_288->cstep;
              local_2a0 = (Mat *)local_288->elemsize;
              pvVar30 = local_288->data;
              piVar33 = (int *)((long)iVar21 * 4 + (long)m_1.data);
              for (uVar35 = 0; uVar35 != local_270; uVar35 = uVar35 + 1) {
                piVar20 = piVar33;
                for (lVar22 = -4; lVar22 != 0; lVar22 = lVar22 + 1) {
                  iVar23 = piVar20[iVar11];
                  iVar24 = piVar20[iVar11 * 2];
                  tmp[0][1][lVar22] = *piVar20 + iVar23 + iVar24;
                  tmp[0][2][lVar22] = (iVar23 - iVar24) + piVar20[iVar11 * 3];
                  piVar20 = piVar20 + lVar32;
                }
                iVar24 = iVar10 + (int)uVar35;
                iVar23 = iVar24 % iVar12;
                uVar39 = (iVar24 / iVar12) * 2;
                piVar20 = (int *)((long)pvVar30 +
                                 (long)(iVar23 * 2) * 4 +
                                 (long)local_288->w * (long)local_2a0 * (long)(int)uVar39 +
                                 ((long)iVar29 + uVar28) * sVar8 * (long)local_2a0);
                piVar40 = tmp[0][0] + 3;
                for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
                  if ((int)(uVar39 | (uint)lVar22) < iVar31) {
                    iVar24 = piVar40[-2];
                    iVar13 = piVar40[-1];
                    iVar3 = *piVar40;
                    *piVar20 = (*(int (*) [4])(piVar40 + -3))[0] + iVar24 + iVar13 >> 2;
                    if (iVar23 * 2 + 1 < iVar38) {
                      piVar20[1] = (iVar24 - iVar13) + iVar3 >> 2;
                    }
                    piVar20 = piVar20 + iVar38;
                  }
                  piVar40 = piVar40 + 4;
                }
                piVar33 = piVar33 + 1;
              }
              iVar21 = iVar21 + iVar11 * 0x10;
              local_278 = uVar28;
              uVar35 = uVar28 + 1;
            }
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar9 = local_268 + 1;
        }
      }
      piVar33 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar33 == (int *)0x0) goto LAB_00249080;
      LOCK();
      *piVar33 = *piVar33 + -1;
      UNLOCK();
      if (*piVar33 != 0) goto LAB_00249080;
      pvVar30 = m.data;
      iVar38 = local_208;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_00249080;
      }
    }
  }
  local_208 = iVar38;
  free(pvVar30);
LAB_00249080:
  piVar33 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        free(local_138.data);
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_208;
}

Assistant:

int conv3x3s1_winograd23_int8_xop(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
    return conv3x3s1_winograd23_int8(bottom_blob, top_blob, AT, nT, opt);
}